

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void QFileDialog::saveFileContent(QByteArray *fileContent,QString *fileNameHint,QWidget *parent)

{
  QFileDialog *this;
  ContextType *in_RDX;
  Object *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *dialog;
  anon_class_24_1_bb74ddbd_for_o fileSelected;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QWidget *this_00;
  AcceptMode mode;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar1;
  QFileDialog *in_stack_ffffffffffffff58;
  QFileDialog *in_stack_ffffffffffffff60;
  QWidget *in_stack_ffffffffffffff68;
  QFileDialog *in_stack_ffffffffffffff70;
  ContextType *context;
  Connection local_70;
  undefined1 *local_68;
  undefined1 *signal;
  ConnectionType in_stack_ffffffffffffffc0;
  QWidget local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QFileDialog *)operator_new(0x28);
  mode = (AcceptMode)((ulong)&local_38.field_0x18 >> 0x20);
  context = in_RDX;
  QString::QString((QString *)0x75a6a6);
  this_00 = &local_38;
  QString::QString((QString *)0x75a6b8);
  QString::QString((QString *)0x75a6ca);
  QFileDialog(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
              (QString *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58,
              (QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  QString::~QString((QString *)0x75a6f2);
  QString::~QString((QString *)0x75a6fc);
  QString::~QString((QString *)0x75a706);
  uVar1 = 1;
  setAcceptMode(this,mode);
  setFileMode(in_stack_ffffffffffffff60,(FileMode)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  selectFile(in_stack_ffffffffffffff58,(QString *)CONCAT44(uVar1,in_stack_ffffffffffffff50));
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  signal = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)in_RDX,
             (QByteArray *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QObject::
  connect<void(QFileDialog::*)(QString_const&),QFileDialog::saveFileContent(QByteArray_const&,QString_const&,QWidget*)::__0&>
            (in_RSI,(offset_in_QFileDialog_to_subr)signal,context,
             (anon_class_24_1_bb74ddbd_for_o *)this,in_stack_ffffffffffffffc0);
  QMetaObject::Connection::~Connection(&local_70);
  QWidget::setAttribute
            (in_RDI,(WidgetAttribute)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
  QWidget::show(this_00);
  saveFileContent(QByteArray_const&,QString_const&,QWidget*)::$_0::~__0
            ((anon_class_24_1_bb74ddbd_for_o *)0x75a7eb);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::saveFileContent(const QByteArray &fileContent, const QString &fileNameHint, QWidget *parent)
{
#ifdef Q_OS_WASM
    Q_UNUSED(parent);
    QWasmLocalFileAccess::saveFile(fileContent, fileNameHint.toStdString());
#else
    QFileDialog *dialog = new QFileDialog(parent);
    dialog->setAcceptMode(QFileDialog::AcceptSave);
    dialog->setFileMode(QFileDialog::AnyFile);
    dialog->selectFile(fileNameHint);

    auto fileSelected = [=](const QString &fileName) {
        if (!fileName.isNull()) {
            QFile selectedFile(fileName);
            if (selectedFile.open(QIODevice::WriteOnly))
                selectedFile.write(fileContent);
        }
    };

    connect(dialog, &QFileDialog::fileSelected, dialog, fileSelected);
    dialog->setAttribute(Qt::WA_DeleteOnClose);
    dialog->show();
#endif
}